

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall
GlobOpt::CaptureValuesIncremental
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  SymKind SVar1;
  Type TVar2;
  CapturedValues *pCVar3;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar4
  ;
  JitArenaAllocator *pJVar5;
  StackSym *pSVar6;
  ValueInfo *this_00;
  long lVar7;
  code *pcVar8;
  undefined1 auVar9 [8];
  NodeBase *pNVar10;
  bool bVar11;
  BOOLEAN BVar12;
  bool bVar13;
  uint uVar14;
  undefined4 *puVar15;
  Type *pTVar16;
  Type *pTVar17;
  Value *pVVar18;
  HashBucket *pHVar19;
  VarConstantValueInfo *pVVar20;
  Type_conflict pBVar21;
  ulong uVar22;
  StackSym *pSVar23;
  ulong uVar24;
  uint key;
  bool bVar25;
  BailoutConstantValue param2;
  BailoutConstantValue param2_00;
  BailoutConstantValue param2_01;
  undefined1 local_98 [8];
  BailoutConstantValue constValue;
  int32 intConstValue;
  undefined1 local_58 [8];
  Iterator iterConst;
  Iterator iterCopyPropSym;
  
  local_58 = (undefined1  [8])(block->globOptData).capturedValues;
  iterCopyPropSym.list = &((CapturedValues *)local_58)->copyPropSyms;
  if (local_58 == (undefined1  [8])0x0) {
    bVar25 = false;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
  }
  else {
    pCVar3 = (CapturedValues *)
             (((CapturedValues *)local_58)->constantValues).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    bVar25 = (undefined1  [8])pCVar3 != local_58;
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    if (bVar25) {
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)pCVar3;
    }
  }
  iterConst.current = &(iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  if (local_58 == (undefined1  [8])0x0) {
    bVar11 = false;
  }
  else {
    if (iterCopyPropSym.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar11) {
LAB_0049033c:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar15 = 0;
    }
    pSVar4 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    bVar11 = pSVar4 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)iterConst.current;
    iterCopyPropSym.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
    if (bVar11) {
      iterCopyPropSym.list = pSVar4;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,0xffffffff);
  if (argsToCapture != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((block->globOptData).changedSyms,argsToCapture);
  }
  pBVar21 = ((block->globOptData).changedSyms)->head;
  if (pBVar21 != (Type_conflict)0x0) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      uVar24 = (pBVar21->data).word;
      if (uVar24 != 0) {
        TVar2 = pBVar21->startIndex;
        uVar22 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar22);
          if (bVar25) {
            pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)local_58);
            pSVar23 = pTVar16->key;
          }
          else {
            pSVar23 = (StackSym *)0x0;
          }
          key = (BVIndex)uVar22 + TVar2;
          if (pSVar23 != (StackSym *)0x0) {
            uVar14 = (pSVar23->super_Sym).m_id;
            if (uVar14 < key) {
              do {
                if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar25 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                      ,0x73,"(constSym->IsStackSym())","constSym->IsStackSym()");
                  if (!bVar25) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar25 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                      ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar25) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                if (((*(uint *)&pSVar23->field_0x18 >> 0x15 | *(uint *)&pSVar23->field_0x18 >> 0x14)
                    & 1) == 0) {
                  pJVar5 = this->func->m_alloc;
                  if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar15 = 1;
                    bVar25 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar25) goto LAB_0049033c;
                    *puVar15 = 0;
                  }
                  pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)local_58);
                  param2._4_4_ = 0;
                  param2.type = (pTVar16->value).type;
                  param2._1_3_ = *(undefined3 *)&(pTVar16->value).field_0x1;
                  param2.u = (pTVar16->value).u;
                  SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
                  ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                            ((EditingIterator *)bailOutConstValuesIter,&pJVar5->super_ArenaAllocator
                             ,pSVar23,param2);
                }
                if (iterConst.list ==
                    (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar25 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar25) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                auVar9 = local_58;
                pCVar3 = (CapturedValues *)
                         ((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                iterConst.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      *)0x0;
                pSVar23 = (StackSym *)0x0;
                if ((undefined1  [8])pCVar3 != local_58) {
                  iterConst.list =
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                        *)pCVar3;
                  pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)local_58);
                  pSVar23 = pTVar16->key;
                }
                if (pSVar23 == (StackSym *)0x0) {
                  bVar25 = (undefined1  [8])pCVar3 != auVar9;
                  goto LAB_0048f9a5;
                }
                uVar14 = (pSVar23->super_Sym).m_id;
              } while (uVar14 < key);
              bVar25 = (undefined1  [8])pCVar3 != auVar9;
            }
            if (uVar14 == key) {
              if (iterConst.list ==
                  (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar25 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar25) goto LAB_0049033c;
                *puVar15 = 0;
              }
              iterConst.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                    *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
              bVar25 = (undefined1  [8])iterConst.list != local_58;
              if (!bVar25) {
                iterConst.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                      *)0x0;
              }
            }
          }
LAB_0048f9a5:
          if (bVar11) {
            pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      ::Iterator::Data((Iterator *)&iterConst.current);
            pSVar23 = pTVar17->key;
          }
          else {
            pSVar23 = (StackSym *)0x0;
          }
          if (pSVar23 != (StackSym *)0x0) {
            uVar14 = (pSVar23->super_Sym).m_id;
            if (uVar14 < key) {
              do {
                pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                          ::Iterator::Data((Iterator *)&iterConst.current);
                pSVar6 = pTVar17->value;
                if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar11 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                      ,0x87,"(capturedSym->IsStackSym())",
                                      "capturedSym->IsStackSym()");
                  if (!bVar11) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                                   ((block->globOptData).changedSyms,(pSVar6->super_Sym).m_id);
                SVar1 = (pSVar23->super_Sym).m_kind;
                if (BVar12 == '\0') {
                  if (SVar1 != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar15 = 1;
                    bVar11 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar11) goto LAB_0049033c;
                    *puVar15 = 0;
                  }
                  if (((*(uint *)&pSVar23->field_0x18 >> 0x15 |
                       *(uint *)&pSVar23->field_0x18 >> 0x14) & 1) == 0) {
                    pJVar5 = this->func->m_alloc;
                    if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar15 = 1;
                      bVar11 = Js::Throw::ReportAssert
                                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                          ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                      if (!bVar11) goto LAB_0049033c;
                      *puVar15 = 0;
                    }
                    SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>
                    ::EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                              ((EditingIterator *)bailOutCopySymsIter,&pJVar5->super_ArenaAllocator,
                               pSVar23,pSVar6);
                  }
                }
                else {
                  if (SVar1 != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar15 = 1;
                    bVar11 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar11) goto LAB_0049033c;
                    *puVar15 = 0;
                  }
                  if ((((*(uint *)&pSVar23->field_0x18 >> 0x15 |
                        *(uint *)&pSVar23->field_0x18 >> 0x14) & 1) == 0) &&
                     (pVVar18 = GlobOptBlockData::FindValue
                                          (&this->currentBlock->globOptData,&pSVar23->super_Sym),
                     pVVar18 != (Value *)0x0)) {
                    CaptureCopyPropValue(this,block,&pSVar23->super_Sym,pVVar18,bailOutCopySymsIter)
                    ;
                  }
                }
                if (iterCopyPropSym.list ==
                    (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                     *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar11 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar11) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                pNVar10 = iterConst.current;
                pSVar4 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                          *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).
                            next;
                pSVar23 = (StackSym *)0x0;
                iterCopyPropSym.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)0x0;
                if (pSVar4 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                               *)iterConst.current) {
                  pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                            ::Iterator::Data((Iterator *)&iterConst.current);
                  pSVar23 = pTVar17->key;
                  iterCopyPropSym.list = pSVar4;
                }
                if (pSVar23 == (StackSym *)0x0) {
                  bVar11 = pSVar4 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                                      *)pNVar10;
                  goto LAB_0048fcd3;
                }
                uVar14 = (pSVar23->super_Sym).m_id;
              } while (uVar14 < key);
              bVar11 = pSVar4 != (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                                  *)pNVar10;
            }
            if (uVar14 == key) {
              if (iterCopyPropSym.list ==
                  (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                   *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar11 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
                if (!bVar11) goto LAB_0049033c;
                *puVar15 = 0;
              }
              iterCopyPropSym.list =
                   (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                    *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
              bVar11 = iterCopyPropSym.list !=
                       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                        *)iterConst.current;
              if (!bVar11) {
                iterCopyPropSym.list =
                     (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                      *)0x0;
              }
            }
          }
LAB_0048fcd3:
          if ((key != 0xffffffff) &&
             (pHVar19 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                                  ((block->globOptData).symToValueMap,key),
             pHVar19 != (HashBucket *)0x0)) {
            pSVar23 = (StackSym *)pHVar19->value;
            if ((pSVar23->super_Sym).m_kind == SymKindStack) {
              if ((pSVar23->field_0x19 & 0x20) == 0) {
                if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar13 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                      ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                  if (!bVar13) goto LAB_0049033c;
                  *puVar15 = 0;
                }
                if (((*(uint *)&pSVar23->field_0x18 >> 0x15 | *(uint *)&pSVar23->field_0x18 >> 0x14)
                    & 1) == 0) goto LAB_0048fd70;
              }
            }
            else {
LAB_0048fd70:
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                  ,0xac,
                                  "(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()))"
                                  ,
                                  "symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum())"
                                 );
              if (!bVar13) goto LAB_0049033c;
              *puVar15 = 0;
            }
            pVVar18 = pHVar19->element;
            if (pVVar18 == (Value *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar13 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                  ,0xaf,"(val)","val");
              if (!bVar13) goto LAB_0049033c;
              *puVar15 = 0;
            }
            this_00 = pVVar18->valueInfo;
            if (this_00->symStore != (Sym *)0x0) {
              bVar13 = ValueInfo::TryGetIntConstantValue
                                 (this_00,(int32 *)((long)&constValue.u.intConst.value + 4),false);
              if (bVar13) {
                constValue._0_8_ = SEXT48((int)constValue.u.intConst.value._4_4_);
                local_98[0] = 3;
              }
              else {
                bVar13 = ValueInfo::IsVarConstant(this_00);
                if (!bVar13) {
                  CaptureCopyPropValue(this,block,(Sym *)pSVar23,pVVar18,bailOutCopySymsIter);
                  goto LAB_0048feee;
                }
                pVVar20 = ValueInfo::AsVarConstant(this_00);
                BailoutConstantValue::InitVarConstValue
                          ((BailoutConstantValue *)local_98,pVVar20->varValue);
              }
              pJVar5 = this->func->m_alloc;
              if ((pSVar23->super_Sym).m_kind != SymKindStack) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar13 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                    ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                if (!bVar13) goto LAB_0049033c;
                *puVar15 = 0;
              }
              param2_00._4_4_ = 0;
              param2_00._0_4_ = local_98._0_4_;
              param2_00.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
              SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
              ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                        ((EditingIterator *)bailOutConstValuesIter,&pJVar5->super_ArenaAllocator,
                         pSVar23,param2_00);
            }
          }
LAB_0048feee:
          uVar24 = uVar24 & ~(1L << (uVar22 & 0x3f));
          lVar7 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar22 = (ulong)(-(uint)(uVar24 == 0) | (uint)lVar7);
        } while (uVar24 != 0);
      }
      pBVar21 = pBVar21->next;
    } while (pBVar21 != (Type)0x0);
  }
  if (bVar25) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)local_58);
      pSVar23 = pTVar16->key;
      if ((pSVar23->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xd1,"(constSym->IsStackSym())","constSym->IsStackSym()");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((block->globOptData).changedSyms,(pSVar23->super_Sym).m_id);
      if (BVar12 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xd2,"(!block->globOptData.changedSyms->Test(constSym->m_id))",
                            "!block->globOptData.changedSyms->Test(constSym->m_id)");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      if ((pSVar23->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      if (((*(uint *)&pSVar23->field_0x18 >> 0x15 | *(uint *)&pSVar23->field_0x18 >> 0x14) & 1) == 0
         ) {
        pJVar5 = this->func->m_alloc;
        if ((pSVar23->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar25 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar25) goto LAB_0049033c;
          *puVar15 = 0;
        }
        pTVar16 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)local_58);
        param2_01._4_4_ = 0;
        param2_01.type = (pTVar16->value).type;
        param2_01._1_3_ = *(undefined3 *)&(pTVar16->value).field_0x1;
        param2_01.u = (pTVar16->value).u;
        SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
        ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                  ((EditingIterator *)bailOutConstValuesIter,&pJVar5->super_ArenaAllocator,pSVar23,
                   param2_01);
      }
      if (iterConst.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      iterConst.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)((iterConst.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    } while ((undefined1  [8])iterConst.list != local_58);
    iterConst.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)0x0;
  }
  if (bVar11) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)&iterConst.current);
      pSVar23 = pTVar17->key;
      pTVar17 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)&iterConst.current);
      pSVar6 = pTVar17->value;
      if ((pSVar23->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xe1,"(capturedSym->IsStackSym())","capturedSym->IsStackSym()");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((block->globOptData).changedSyms,(pSVar23->super_Sym).m_id);
      if ((BVar12 != '\0') ||
         (BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((block->globOptData).changedSyms,(pSVar6->super_Sym).m_id),
         BVar12 != '\0')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                            ,0xe3,
                            "(!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))"
                            ,
                            "!block->globOptData.changedSyms->Test(capturedSym->m_id) && !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id)"
                           );
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      if ((pSVar23->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                            ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      if (((*(uint *)&pSVar23->field_0x18 >> 0x15 | *(uint *)&pSVar23->field_0x18 >> 0x14) & 1) == 0
         ) {
        pJVar5 = this->func->m_alloc;
        if ((pSVar23->super_Sym).m_kind != SymKindStack) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar25 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                              ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar25) goto LAB_0049033c;
          *puVar15 = 0;
        }
        SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
        EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                  ((EditingIterator *)bailOutCopySymsIter,&pJVar5->super_ArenaAllocator,pSVar23,
                   pSVar6);
      }
      if (iterCopyPropSym.list ==
          (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar25 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar25) goto LAB_0049033c;
        *puVar15 = 0;
      }
      iterCopyPropSym.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)((iterCopyPropSym.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    } while (iterCopyPropSym.list !=
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)iterConst.current);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureValuesIncremental(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    CapturedValues * currCapturedValues = block->globOptData.capturedValues;
    SListBase<ConstantStackSymValue>::Iterator iterConst(currCapturedValues ? &currCapturedValues->constantValues : nullptr);
    SListBase<CopyPropSyms>::Iterator iterCopyPropSym(currCapturedValues ? &currCapturedValues->copyPropSyms : nullptr);
    bool hasConstValue = currCapturedValues ? iterConst.Next() : false;
    bool hasCopyPropSym = currCapturedValues ? iterCopyPropSym.Next() : false;

    block->globOptData.changedSyms->Set(Js::Constants::InvalidSymID);

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        Value * val = nullptr;

        // First process all unchanged syms with m_id < symId. Then, recapture the current changed sym.

        // copy unchanged const sym to new capturedValues
        Sym * constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        while (constSym && constSym->m_id < symId)
        {
            Assert(constSym->IsStackSym());
            if (!constSym->AsStackSym()->HasArgSlotNum())
            {
                bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
            }

            hasConstValue = iterConst.Next();
            constSym = hasConstValue ? iterConst.Data().Key() : nullptr;
        }
        if (constSym && constSym->m_id == symId)
        {
            hasConstValue = iterConst.Next();
        }

        // process unchanged sym; copy-prop sym might have changed
        Sym * capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        while (capturedSym && capturedSym->m_id < symId)
        {
            StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

            Assert(capturedSym->IsStackSym());

            if (!block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id))
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
                }
            }
            else
            {
                if (!capturedSym->AsStackSym()->HasArgSlotNum())
                {
                    val = this->currentBlock->globOptData.FindValue(capturedSym);
                    if (val != nullptr)
                    {
                        CaptureCopyPropValue(block, capturedSym, val, bailOutCopySymsIter);
                    }
                }
            }

            hasCopyPropSym = iterCopyPropSym.Next();
            capturedSym = hasCopyPropSym ? iterCopyPropSym.Data().Key() : nullptr;
        }
        if (capturedSym && capturedSym->m_id == symId)
        {
            hasCopyPropSym = iterCopyPropSym.Next();
        }

        // recapture changed sym
        HashBucket<Sym *, Value *> * symIdBucket = nullptr;
        if (symId != Js::Constants::InvalidSymID)
        {
            symIdBucket = block->globOptData.symToValueMap->GetBucket(symId);
            if (symIdBucket != nullptr)
            {
                Sym * symIdSym = symIdBucket->value;
                Assert(symIdSym->IsStackSym() && (symIdSym->AsStackSym()->HasByteCodeRegSlot() || symIdSym->AsStackSym()->HasArgSlotNum()));

                val = symIdBucket->element;
                Assert(val);
                ValueInfo* valueInfo = val->GetValueInfo();

                if (valueInfo->GetSymStore() != nullptr)
                {
                    int32 intConstValue;
                    BailoutConstantValue constValue;

                    if (valueInfo->TryGetIntConstantValue(&intConstValue))
                    {
                        constValue.InitIntConstValue(intConstValue);
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else if (valueInfo->IsVarConstant())
                    {
                        constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
                        bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, symIdSym->AsStackSym(), constValue);
                    }
                    else
                    {
                        CaptureCopyPropValue(block, symIdSym, val, bailOutCopySymsIter);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV

    // If, after going over the set of changed syms since the last time we captured values,
    // there are remaining unprocessed entries in the current captured values set,
    // they can simply be copied over to the new bailout info.
    while (hasConstValue)
    {
        Sym * constSym = iterConst.Data().Key();
        Assert(constSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(constSym->m_id));

        if (!constSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, constSym->AsStackSym(), iterConst.Data().Value());
        }

        hasConstValue = iterConst.Next();
    }

    while (hasCopyPropSym)
    {
        Sym * capturedSym = iterCopyPropSym.Data().Key();
        StackSym * capturedCopyPropSym = iterCopyPropSym.Data().Value();

        Assert(capturedSym->IsStackSym());
        Assert(!block->globOptData.changedSyms->Test(capturedSym->m_id) &&
            !block->globOptData.changedSyms->Test(capturedCopyPropSym->m_id));

        if (!capturedSym->AsStackSym()->HasArgSlotNum())
        {
            bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, capturedSym->AsStackSym(), capturedCopyPropSym);
        }

        hasCopyPropSym = iterCopyPropSym.Next();
    }
}